

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roboclaw.cpp
# Opt level: O0

void __thiscall RoboClaw::RoboClaw(RoboClaw *this)

{
  char *ctx;
  RoboClaw *in_RDI;
  allocator local_9 [9];
  
  in_RDI->_vptr_RoboClaw = (_func_int **)&PTR_write_0010cd88;
  std::allocator<char>::allocator();
  ctx = "/dev/ttyS0";
  std::__cxx11::string::string((string *)&in_RDI->m_portName,"/dev/ttyS0",local_9);
  std::allocator<char>::~allocator((allocator<char> *)local_9);
  in_RDI->m_timeout = 5;
  in_RDI->m_address = 0x80;
  init(in_RDI,(EVP_PKEY_CTX *)ctx);
  return;
}

Assistant:

RoboClaw::RoboClaw()
    : m_portName( "/dev/ttyS0" )
    , m_timeout( 5 )
    , m_address( 0x80 )  // 0x80-0x87 is used to identify a RoboClaw on a serial port, but on USB this is ignored.
{
    init();
}